

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseMap(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int iVar1;
  ParseState *this_00;
  Token *pTVar2;
  Type TVar3;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar4;
  Value VVar5;
  Lexer local_1f0;
  Lexer local_1e8;
  Lexer local_1e0;
  Lexer local_1d8;
  Lexer local_1d0;
  Lexer local_1c8;
  Lexer local_1c0;
  Token local_1b8;
  ValueDict map;
  Value local_180;
  Value local_170;
  Value local_160;
  String local_150;
  String local_140;
  Value value;
  Value key;
  Token local_110;
  Token local_f0;
  Token local_d0;
  Token local_b0;
  TACLine local_90;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  Lexer::Peek(&local_1b8,this_01);
  TVar3 = local_1b8.type;
  String::~String(&local_1b8.text);
  if (TVar3 == LCurly) {
    Lexer::Dequeue(&local_b0,this_01);
    String::~String(&local_b0.text);
    map._vptr_Dictionary = (_func_int **)&PTR__Dictionary_00166240;
    map.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    map.isTemp = false;
    Lexer::Peek(&local_1b8,this_01);
    TVar3 = local_1b8.type;
    String::~String(&local_1b8.text);
    if (TVar3 == RCurly) {
      Lexer::Dequeue(&local_d0,this_01);
      pTVar2 = &local_d0;
LAB_001357ea:
      String::~String(&pTVar2->text);
    }
    else {
      do {
        local_1f0.ls = this_01->ls;
        if (local_1f0.ls != (LexerStorage *)0x0) {
          (local_1f0.ls)->refCount = (local_1f0.ls)->refCount + 1;
        }
        AllowLineBreak(&local_1f0);
        Lexer::release(&local_1f0);
        Lexer::Peek(&local_1b8,this_01);
        TVar3 = local_1b8.type;
        String::~String(&local_1b8.text);
        if (TVar3 == RCurly) {
          Lexer::Dequeue(&local_f0,this_01);
          pTVar2 = &local_f0;
          goto LAB_001357ea;
        }
        local_1c0.ls = this_01->ls;
        if (local_1c0.ls != (LexerStorage *)0x0) {
          (local_1c0.ls)->refCount = (local_1c0.ls)->refCount + 1;
        }
        ParseExpr((Parser *)&key,tokens,SUB81(&local_1c0,0),false);
        Lexer::release(&local_1c0);
        local_1c8.ls = this_01->ls;
        if (local_1c8.ls != (LexerStorage *)0x0) {
          (local_1c8.ls)->refCount = (local_1c8.ls)->refCount + 1;
        }
        local_140.ss = (StringStorage *)0x0;
        local_140.isTemp = false;
        RequireToken(&local_110,(Parser *)tokens,&local_1c8,Colon,&local_140);
        String::~String(&local_110.text);
        String::~String(&local_140);
        Lexer::release(&local_1c8);
        local_1d0.ls = this_01->ls;
        if (local_1d0.ls != (LexerStorage *)0x0) {
          (local_1d0.ls)->refCount = (local_1d0.ls)->refCount + 1;
        }
        AllowLineBreak(&local_1d0);
        Lexer::release(&local_1d0);
        local_1d8.ls = this_01->ls;
        if (local_1d8.ls != (LexerStorage *)0x0) {
          (local_1d8.ls)->refCount = (local_1d8.ls)->refCount + 1;
        }
        ParseExpr((Parser *)&value,tokens,SUB81(&local_1d8,0),false);
        Lexer::release(&local_1d8);
        Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                  (&map,&key,&value);
        local_1e0.ls = this_01->ls;
        if (local_1e0.ls != (LexerStorage *)0x0) {
          (local_1e0.ls)->refCount = (local_1e0.ls)->refCount + 1;
        }
        local_150.ss = (StringStorage *)0x0;
        local_150.isTemp = false;
        RequireEitherToken(&local_1b8,(Parser *)tokens,&local_1e0,Comma,RCurly,&local_150);
        TVar3 = local_1b8.type;
        String::~String(&local_1b8.text);
        String::~String(&local_150);
        Lexer::release(&local_1e0);
        Value::~Value(&value);
        Value::~Value(&key);
      } while (TVar3 != RCurly);
    }
    this_00 = (ParseState *)tokens[6].ls;
    iVar1 = this_00->nextTempNum;
    this_00->nextTempNum = iVar1 + 1;
    *(undefined2 *)&(this->errorContext).ss = 2;
    *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
    *(int *)&(this->errorContext).isTemp = iVar1;
    Value::Value(&local_160,(Value *)this);
    Value::Value(&local_170,&map);
    Value::Value(&local_180,(Value *)Value::null);
    TACLine::TACLine(&local_90,&local_160,CopyA,&local_170,&local_180);
    ParseState::Add(this_00,&local_90);
    TACLine::~TACLine(&local_90);
    Value::~Value(&local_180);
    Value::~Value(&local_170);
    Value::~Value(&local_160);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary(&map);
    aVar4 = extraout_RDX_00;
  }
  else {
    local_1e8.ls = this_01->ls;
    if (local_1e8.ls != (LexerStorage *)0x0) {
      (local_1e8.ls)->refCount = (local_1e8.ls)->refCount + 1;
    }
    ParseList(this,tokens,SUB81(&local_1e8,0),statementStart);
    Lexer::release(&local_1e8);
    aVar4 = extraout_RDX;
  }
  VVar5.data.number = aVar4.number;
  VVar5._0_8_ = this;
  return VVar5;
}

Assistant:

Value Parser::ParseMap(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseList;
		if (tokens.Peek().type != Token::Type::LCurly) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();
		// NOTE: we must be sure this map gets created at runtime, not here at parse time.
		// Since it is a mutable object, we need to return a different one each time
		// this code executes (in a loop, function, etc.).  So, we use Op.CopyA below!
		ValueDict map;
		if (tokens.Peek().type == Token::Type::RCurly) {
			tokens.Dequeue();
		} else while (true) {
			AllowLineBreak(tokens); // allow a line break after a comma or open brace
			
			// Allow the map to close with a } on its own line.
			if (tokens.Peek().type == Token::Type::RCurly) {
				tokens.Dequeue();
				break;
			}

			Value key = ParseExpr(tokens);
			RequireToken(tokens, Token::Type::Colon);
			AllowLineBreak(tokens); // allow a line break after a colon
			Value value = ParseExpr(tokens);

			map.SetValue(key, value);

			if (RequireEitherToken(tokens, Token::Type::Comma, Token::Type::RCurly).type == Token::Type::RCurly) break;
		}
		Value result = Value::Temp(output->nextTempNum++);
		output->Add(TACLine(result, TACLine::Op::CopyA, map));
		return result;
	}